

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateServiceDefinitions
          (FileGenerator *this,Printer *printer)

{
  bool bVar1;
  pointer puVar2;
  int i;
  ulong uVar3;
  Formatter format;
  Formatter local_68;
  
  local_68.printer_ = printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&local_68.vars_._M_t,&(this->variables_)._M_t);
  bVar1 = HasGenericServices(this->file_,&this->options_);
  if (bVar1) {
    for (uVar3 = 0;
        puVar2 = (this->service_generators_).
                 super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        uVar3 < (ulong)((long)(this->service_generators_).
                              super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 3);
        uVar3 = uVar3 + 1) {
      if (uVar3 != 0) {
        Formatter::operator()<>(&local_68,"\n");
        Formatter::operator()<>
                  (&local_68,
                   "// -------------------------------------------------------------------\n");
        Formatter::operator()<>(&local_68,"\n");
        puVar2 = (this->service_generators_).
                 super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      ServiceGenerator::GenerateDeclarations
                ((ServiceGenerator *)
                 puVar2[uVar3]._M_t.
                 super___uniq_ptr_impl<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>
                 ._M_t,printer);
    }
    Formatter::operator()<>(&local_68,"\n");
    Formatter::operator()<>
              (&local_68,"// ===================================================================\n")
    ;
    Formatter::operator()<>(&local_68,"\n");
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_68.vars_._M_t);
  return;
}

Assistant:

void FileGenerator::GenerateServiceDefinitions(io::Printer* printer) {
  Formatter format(printer, variables_);
  if (HasGenericServices(file_, options_)) {
    // Generate service definitions.
    for (int i = 0; i < service_generators_.size(); i++) {
      if (i > 0) {
        format("\n");
        format(kThinSeparator);
        format("\n");
      }
      service_generators_[i]->GenerateDeclarations(printer);
    }

    format("\n");
    format(kThickSeparator);
    format("\n");
  }
}